

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O0

void __thiscall
JsrtExternalObject::JsrtExternalObject
          (JsrtExternalObject *this,JsrtExternalObject *instance,bool deepCopy)

{
  int iVar1;
  Type TVar2;
  int iVar3;
  void *pvVar4;
  void *src;
  bool deepCopy_local;
  JsrtExternalObject *instance_local;
  JsrtExternalObject *this_local;
  
  Js::DynamicObject::DynamicObject
            (&this->super_DynamicObject,&instance->super_DynamicObject,deepCopy);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01dd23c8;
  this->initialized = true;
  SlotInfo::SlotInfo((SlotInfo *)&(this->u).slot);
  iVar1 = GetInlineSlotSize(instance);
  if (iVar1 == 0) {
    this->slotType = External;
    pvVar4 = GetInlineSlots(instance);
    Memory::WriteBarrierPtr<void>::operator=(&(this->u).slot,pvVar4);
  }
  else {
    this->slotType = Inline;
    TVar2 = GetInlineSlotSize(instance);
    (this->u).inlineSlotSize = TVar2;
    pvVar4 = GetInlineSlots(instance);
    if (pvVar4 != (void *)0x0) {
      pvVar4 = GetInlineSlots(this);
      iVar1 = GetInlineSlotSize(this);
      src = GetInlineSlots(instance);
      iVar3 = GetInlineSlotSize(instance);
      memcpy_s(pvVar4,(long)iVar1,src,(long)iVar3);
    }
  }
  return;
}

Assistant:

JsrtExternalObject::JsrtExternalObject(JsrtExternalObject* instance, bool deepCopy) :
    Js::DynamicObject(instance, deepCopy)
{
    if (instance->GetInlineSlotSize() != 0)
    {
        this->slotType = SlotType::Inline;
        this->u.inlineSlotSize = instance->GetInlineSlotSize();
        if (instance->GetInlineSlots())
        {
            memcpy_s(this->GetInlineSlots(), this->GetInlineSlotSize(), instance->GetInlineSlots(), instance->GetInlineSlotSize());
        }
    }
    else
    {
        this->slotType = SlotType::External;
        this->u.slot = instance->GetInlineSlots();
    }
}